

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

TokenStream * __thiscall Lexer::lex(TokenStream *__return_storage_ptr__,Lexer *this)

{
  initializer_list<std::pair<const_char,_TokenKind>_> __l;
  int iVar1;
  anon_class_8_1_8991fb9c local_a8;
  function<Token_()> local_a0;
  allocator<std::pair<const_char,_TokenKind>_> local_6b;
  key_equal local_6a;
  hasher local_69;
  pair<const_char,_TokenKind> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  iterator local_28;
  size_type local_20;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  if (lex()::tokenMap == '\0') {
    iVar1 = __cxa_guard_acquire(&lex()::tokenMap);
    if (iVar1 != 0) {
      local_38 = 0x60000002b;
      uStack_30 = 0x70000002d;
      local_48 = 0x40000005b;
      uStack_40 = 0x50000005d;
      local_58 = 0x20000003c;
      uStack_50 = 0x30000003e;
      local_68.first = '.';
      local_68._1_3_ = 0;
      local_68.second = Dot;
      uStack_60 = 0x10000002c;
      local_28 = &local_68;
      local_20 = 8;
      std::allocator<std::pair<const_char,_TokenKind>_>::allocator(&local_6b);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      unordered_map<char,_TokenKind,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenKind>_>_>
      ::unordered_map(&lex::tokenMap,__l,0,&local_69,&local_6a,&local_6b);
      std::allocator<std::pair<const_char,_TokenKind>_>::~allocator(&local_6b);
      __cxa_atexit(std::
                   unordered_map<char,_TokenKind,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenKind>_>_>
                   ::~unordered_map,&lex::tokenMap,&__dso_handle);
      __cxa_guard_release(&lex()::tokenMap);
    }
  }
  local_a8.this = this;
  std::function<Token()>::function<Lexer::lex()::__0,void>((function<Token()> *)&local_a0,&local_a8)
  ;
  TokenStream::TokenStream(__return_storage_ptr__,&local_a0);
  std::function<Token_()>::~function(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

auto Lexer::lex() -> TokenStream {
    static std::unordered_map<char, TokenKind> tokenMap = {
        { '.', TokenKind::Dot },
        { ',', TokenKind::Comma },
        { '<', TokenKind::LeftAngledBracket },
        { '>', TokenKind::RightAngledBracket },
        { '[', TokenKind::LeftBracket },
        { ']', TokenKind::RightBracket },
        { '+', TokenKind::Plus },
        { '-', TokenKind::Minus }
    };

    return TokenStream([&]() {
        char character;
        TextSpan span = TextSpan(0, 0);
        TokenKind type;

        do {
            character = supply();
            if (character == '\0')
                return Token(TextSpan(position, position), TokenKind::EndOfFile, '\0');

            span = TextSpan(position - 1, position);
            auto search = tokenMap.find(character);
            type = search == tokenMap.end() ? TokenKind::Comment : search->second;
        } while (type == TokenKind::Comment);

        return Token(span, type, character);
    });
}